

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageTest::SwapBuffersWithDamageTest
          (SwapBuffersWithDamageTest *this,EglTestContext *eglTestCtx,
          vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
          *frameDrawType,int iterationTimes,ResizeType resizeType,char *name,char *description)

{
  pointer __src;
  deUint32 dVar1;
  pointer __dest;
  undefined4 in_register_00000084;
  long lVar2;
  size_t __n;
  
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,
                     (char *)CONCAT44(in_register_00000084,resizeType),
                     glcts::fixed_sample_locations_values + 1);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SwapBuffersWithDamageTest_02110590;
  this->m_window = (NativeWindow *)0x0;
  this->m_eglContext = (EGLContext)0x0;
  dVar1 = deStringHash((char *)CONCAT44(in_register_00000084,resizeType));
  this->m_seed = dVar1;
  this->m_iterationTimes = 4;
  lVar2 = (long)(frameDrawType->
                super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(frameDrawType->
                super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                )._M_impl.super__Vector_impl_data._M_start;
  (this->m_frameDrawType).
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_frameDrawType).
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_frameDrawType).
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __dest = std::
           _Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
           ::_M_allocate((_Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                          *)(lVar2 >> 2),(size_t)eglTestCtx);
  (this->m_frameDrawType).
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = __dest;
  (this->m_frameDrawType).
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = __dest;
  (this->m_frameDrawType).
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar2 + (long)__dest);
  __src = (frameDrawType->
          super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
          )._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(frameDrawType->
              super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove(__dest,__src,__n);
  }
  (this->m_frameDrawType).
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__dest + __n);
  this->m_resizeType = iterationTimes;
  this->m_eglDisplay = (EGLDisplay)0x0;
  this->m_eglSurface = (EGLSurface)0x0;
  glw::Functions::Functions(&this->m_gl);
  this->m_gles2Renderer = (GLES2Renderer *)0x0;
  return;
}

Assistant:

SwapBuffersWithDamageTest::SwapBuffersWithDamageTest (EglTestContext& eglTestCtx, const vector<DrawType>& frameDrawType, int iterationTimes, ResizeType resizeType, const char* name, const char* description)
	: TestCase			(eglTestCtx, name, description)
	, m_window			(DE_NULL)
	, m_eglContext		(EGL_NO_CONTEXT)
	, m_seed			(deStringHash(name))
	, m_iterationTimes	(iterationTimes)
	, m_frameDrawType	(frameDrawType)
	, m_resizeType		(resizeType)
	, m_eglDisplay		(EGL_NO_DISPLAY)
	, m_eglSurface		(EGL_NO_SURFACE)
	, m_gles2Renderer	 (DE_NULL)
{
}